

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableUpdateBorders(ImGuiTable *table)

{
  float fVar1;
  char cVar2;
  ImGuiTableColumn *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  ImGuiTableInstanceData *pIVar6;
  int order_n;
  ulong uVar7;
  ImGuiID id;
  uint uVar8;
  float fVar9;
  float fVar10;
  bool hovered;
  bool held;
  float local_68;
  float local_64;
  ImRect hit_rect;
  
  pIVar4 = GImGui;
  if ((long)table->InstanceCurrent == 0) {
    pIVar6 = &table->InstanceDataFirst;
  }
  else {
    pIVar6 = (table->InstanceDataExtra).Data + (long)table->InstanceCurrent + -1;
  }
  local_64 = (table->OuterRect).Min.y;
  fVar1 = (table->OuterRect).Max.y;
  fVar10 = pIVar6->LastOuterHeight + local_64;
  uVar8 = -(uint)(fVar10 <= fVar1);
  local_68 = pIVar6->LastFirstRowHeight + local_64;
  uVar7 = 0;
  do {
    if ((long)table->ColumnsCount <= (long)uVar7) {
      return;
    }
    if ((table->EnabledMaskByDisplayOrder >> (uVar7 & 0x3f) & 1) != 0) {
      pIVar3 = (table->Columns).Data;
      cVar2 = (table->DisplayOrderToIndex).Data[uVar7];
      if ((((pIVar3[cVar2].Flags & 0x40000020U) == 0) &&
          ((hit_rect.Max.y = (float)(uVar8 & (uint)fVar1 | ~uVar8 & (uint)fVar10),
           (table->Flags & 0x800) == 0 ||
           (hit_rect.Max.y = local_68, table->IsUsingHeaders != false)))) &&
         ((pIVar3[cVar2].IsVisibleX != false || (table->LastResizedColumn == cVar2)))) {
        id = (int)table->InstanceCurrent * table->ColumnsCount + (int)cVar2 + table->ID + 1;
        hit_rect.Min.x = pIVar3[cVar2].MaxX + -4.0;
        hit_rect.Max.x = pIVar3[cVar2].MaxX + 4.0;
        hit_rect.Min.y = local_64;
        ItemAdd(&hit_rect,id,(ImRect *)0x0,8);
        hovered = false;
        held = false;
        bVar5 = ButtonBehavior(&hit_rect,id,&hovered,&held,0x41910);
        if ((bVar5) && (bVar5 = IsMouseDoubleClicked(0), bVar5)) {
          pIVar3 = (table->Columns).Data;
          if (pIVar3[cVar2].IsEnabled == true) {
            pIVar3[cVar2].CannotSkipItemsQueue = '\x01';
            table->AutoFitSingleColumn = cVar2;
          }
          ClearActiveID();
          hovered = false;
          held = false;
        }
        if (held == true) {
          if (table->LastResizedColumn == -1) {
            fVar9 = -3.4028235e+38;
            if ((long)table->RightMostEnabledColumn != -1) {
              fVar9 = (table->Columns).Data[table->RightMostEnabledColumn].MaxX;
            }
            table->ResizeLockMinContentsX2 = fVar9;
          }
          table->ResizedColumn = cVar2;
          table->InstanceInteracted = table->InstanceCurrent;
          if (hovered != false) {
LAB_002046ef:
            if (pIVar4->HoveredIdTimer <= 0.06 && held == false) goto LAB_0020458f;
          }
          table->HoveredColumnBorder = cVar2;
          SetMouseCursor(4);
        }
        else if (hovered == true) goto LAB_002046ef;
      }
    }
LAB_0020458f:
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void ImGui::TableUpdateBorders(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(table->Flags & ImGuiTableFlags_Resizable);

    // At this point OuterRect height may be zero or under actual final height, so we rely on temporal coherency and
    // use the final height from last frame. Because this is only affecting _interaction_ with columns, it is not
    // really problematic (whereas the actual visual will be displayed in EndTable() and using the current frame height).
    // Actual columns highlight/render will be performed in EndTable() and not be affected.
    ImGuiTableInstanceData* table_instance = TableGetInstanceData(table, table->InstanceCurrent);
    const float hit_half_width = TABLE_RESIZE_SEPARATOR_HALF_THICKNESS;
    const float hit_y1 = table->OuterRect.Min.y;
    const float hit_y2_body = ImMax(table->OuterRect.Max.y, hit_y1 + table_instance->LastOuterHeight);
    const float hit_y2_head = hit_y1 + table_instance->LastFirstRowHeight;

    for (int order_n = 0; order_n < table->ColumnsCount; order_n++)
    {
        if (!(table->EnabledMaskByDisplayOrder & ((ImU64)1 << order_n)))
            continue;

        const int column_n = table->DisplayOrderToIndex[order_n];
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->Flags & (ImGuiTableColumnFlags_NoResize | ImGuiTableColumnFlags_NoDirectResize_))
            continue;

        // ImGuiTableFlags_NoBordersInBodyUntilResize will be honored in TableDrawBorders()
        const float border_y2_hit = (table->Flags & ImGuiTableFlags_NoBordersInBody) ? hit_y2_head : hit_y2_body;
        if ((table->Flags & ImGuiTableFlags_NoBordersInBody) && table->IsUsingHeaders == false)
            continue;

        if (!column->IsVisibleX && table->LastResizedColumn != column_n)
            continue;

        ImGuiID column_id = TableGetColumnResizeID(table, column_n, table->InstanceCurrent);
        ImRect hit_rect(column->MaxX - hit_half_width, hit_y1, column->MaxX + hit_half_width, border_y2_hit);
        ItemAdd(hit_rect, column_id, NULL, ImGuiItemFlags_NoNav);
        //GetForegroundDrawList()->AddRect(hit_rect.Min, hit_rect.Max, IM_COL32(255, 0, 0, 100));

        bool hovered = false, held = false;
        bool pressed = ButtonBehavior(hit_rect, column_id, &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_AllowItemOverlap | ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_PressedOnDoubleClick | ImGuiButtonFlags_NoNavFocus);
        if (pressed && IsMouseDoubleClicked(0))
        {
            TableSetColumnWidthAutoSingle(table, column_n);
            ClearActiveID();
            held = hovered = false;
        }
        if (held)
        {
            if (table->LastResizedColumn == -1)
                table->ResizeLockMinContentsX2 = table->RightMostEnabledColumn != -1 ? table->Columns[table->RightMostEnabledColumn].MaxX : -FLT_MAX;
            table->ResizedColumn = (ImGuiTableColumnIdx)column_n;
            table->InstanceInteracted = table->InstanceCurrent;
        }
        if ((hovered && g.HoveredIdTimer > TABLE_RESIZE_SEPARATOR_FEEDBACK_TIMER) || held)
        {
            table->HoveredColumnBorder = (ImGuiTableColumnIdx)column_n;
            SetMouseCursor(ImGuiMouseCursor_ResizeEW);
        }
    }
}